

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeSetPagerFlags(Btree *p,uint pgFlags)

{
  int *piVar1;
  BtShared *pBVar2;
  Pager *pPVar3;
  int extraout_EAX;
  u8 uVar4;
  u8 uVar5;
  uint uVar6;
  bool bVar7;
  
  pBVar2 = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pPVar3 = pBVar2->pPager;
  if (pPVar3->tempFile == '\0') {
    uVar6 = pgFlags & 7;
    bVar7 = 2 < uVar6;
    pPVar3->fullSync = bVar7;
    pPVar3->extraSync = uVar6 == 4;
    pPVar3->noSync = uVar6 == 1;
    if (uVar6 == 1) goto LAB_0021be20;
    if ((pgFlags & 8) == 0) {
      pPVar3->syncFlags = '\x02';
      if ((pgFlags & 0x10) == 0) {
        pPVar3->ckptSyncFlags = '\x02';
      }
      else {
        pPVar3->ckptSyncFlags = '\x03';
      }
      uVar5 = '\x02';
      goto LAB_0021be28;
    }
    uVar5 = '\x03';
  }
  else {
    pPVar3->noSync = '\x01';
    pPVar3->fullSync = '\0';
    pPVar3->extraSync = '\0';
    bVar7 = false;
LAB_0021be20:
    uVar5 = '\0';
  }
  pPVar3->syncFlags = uVar5;
  pPVar3->ckptSyncFlags = uVar5;
LAB_0021be28:
  uVar4 = uVar5 + ' ';
  if (!bVar7) {
    uVar4 = uVar5;
  }
  pPVar3->walSyncFlags = uVar4;
  pPVar3->doNotSpill = pPVar3->doNotSpill & 0xfe | (pgFlags & 0x20) == 0;
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
      return extraout_EAX;
    }
  }
  return (int)pPVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetPagerFlags(
  Btree *p,              /* The btree to set the safety level on */
  unsigned pgFlags       /* Various PAGER_* flags */
){
  BtShared *pBt = p->pBt;
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  sqlite3PagerSetFlags(pBt->pPager, pgFlags);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}